

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O1

void __thiscall antlr::ASTFactory::addASTChild(ASTFactory *this,ASTPair *currentAST,RefAST *child)

{
  ASTRef *pAVar1;
  ASTRef *pAVar2;
  ASTRef *pAVar3;
  AST *pAVar4;
  ASTRefCount<antlr::AST> *this_00;
  ASTRefCount<antlr::AST> local_28;
  ASTRefCount<antlr::AST> local_20;
  
  this_00 = &local_28;
  pAVar3 = child->ref;
  if ((pAVar3 != (ASTRef *)0x0) && (pAVar3->ptr != (AST *)0x0)) {
    pAVar1 = (currentAST->root).ref;
    if ((pAVar1 == (ASTRef *)0x0) || (pAVar1->ptr == (AST *)0x0)) {
      ASTRefCount<antlr::AST>::operator=(&currentAST->root,child);
    }
    else {
      pAVar2 = (currentAST->child).ref;
      if ((pAVar2 == (ASTRef *)0x0) || (pAVar2->ptr == (AST *)0x0)) {
        if (pAVar1 == (ASTRef *)0x0) {
          pAVar4 = (AST *)0x0;
        }
        else {
          pAVar4 = pAVar1->ptr;
        }
        if (pAVar3 == (ASTRef *)0x0) {
          pAVar3 = (ASTRef *)0x0;
        }
        else {
          pAVar3->count = pAVar3->count + 1;
        }
        local_20.ref = pAVar3;
        (*pAVar4->_vptr_AST[0x14])(pAVar4,&local_20);
        this_00 = &local_20;
      }
      else {
        if (pAVar2 == (ASTRef *)0x0) {
          pAVar4 = (AST *)0x0;
        }
        else {
          pAVar4 = pAVar2->ptr;
        }
        if (pAVar3 == (ASTRef *)0x0) {
          pAVar3 = (ASTRef *)0x0;
        }
        else {
          pAVar3->count = pAVar3->count + 1;
        }
        local_28.ref = pAVar3;
        (*pAVar4->_vptr_AST[0x15])(pAVar4,&local_28);
      }
      ASTRefCount<antlr::AST>::~ASTRefCount(this_00);
    }
    ASTRefCount<antlr::AST>::operator=(&currentAST->child,child);
    ASTPair::advanceChildToEnd(currentAST);
  }
  return;
}

Assistant:

void ASTFactory::setMaxNodeType( int type )
{
	if( nodeFactories.size() < (static_cast<unsigned int>(type)+1) )
		nodeFactories.resize( type+1, &default_factory_descriptor );
}